

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_wrapper_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::csharp::WrapperFieldGenerator::GenerateSerializationCode
          (WrapperFieldGenerator *this,Printer *printer,bool use_write_context)

{
  char *__str;
  string_view local_30;
  undefined1 local_19;
  Printer *pPStack_18;
  bool use_write_context_local;
  Printer *printer_local;
  WrapperFieldGenerator *this_local;
  
  __str = 
  "if ($has_property_check$) {\n  _single_$name$_codec.WriteTagAndValue(output, $property_name$);\n}\n"
  ;
  if (use_write_context) {
    __str = 
    "if ($has_property_check$) {\n  _single_$name$_codec.WriteTagAndValue(ref output, $property_name$);\n}\n"
    ;
  }
  local_19 = use_write_context;
  pPStack_18 = printer;
  printer_local = (Printer *)this;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_30,__str);
  io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (printer,&(this->super_FieldGeneratorBase).variables_,local_30);
  return;
}

Assistant:

void WrapperFieldGenerator::GenerateSerializationCode(io::Printer* printer, bool use_write_context) {
  printer->Print(
    variables_,
    use_write_context
    ? "if ($has_property_check$) {\n"
      "  _single_$name$_codec.WriteTagAndValue(ref output, $property_name$);\n"
      "}\n"
    : "if ($has_property_check$) {\n"
      "  _single_$name$_codec.WriteTagAndValue(output, $property_name$);\n"
      "}\n");
}